

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  NodeType NVar1;
  ShaderType SVar2;
  StorageQualifier *pSVar3;
  Variable *pVVar4;
  ArrayElement *pAVar5;
  Node *pNVar6;
  SharedPtr variable_1;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr input;
  
  pNVar6 = parentStructure->m_ptr;
  NVar1 = pNVar6->m_type;
  if (NVar1 == TYPE_DEFAULT_BLOCK) {
    pSVar3 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar3,parentStructure,STORAGE_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&input,(Node *)pSVar3);
  }
  else {
    input.m_state = parentStructure->m_state;
    input.m_ptr = pNVar6;
    if (input.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (input.m_state)->strongRefCount = (input.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (input.m_state)->weakRefCount = (input.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar2 = getShaderMaskFirstStage(presentShadersMask);
  if (includeEmpty && NVar1 == TYPE_DEFAULT_BLOCK) {
    (*genCase)(context,parentStructure,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"empty");
  }
  if (SVar2 == SHADERTYPE_FRAGMENT) {
LAB_012f80c4:
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&input,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    (*genCase)(context,&variable,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pNVar6 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&input);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar6);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_1,(Node *)pVVar4);
    (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var_struct");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pAVar5 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&input,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar5);
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable_1,(Node *)pVVar4);
    (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var_array");
LAB_012f81ec:
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable_1);
  }
  else {
    if (SVar2 != SHADERTYPE_VERTEX) {
      if (NVar1 != TYPE_DEFAULT_BLOCK) goto LAB_012f80c4;
      if ((SVar2 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
        pAVar5 = (ArrayElement *)operator_new(0x28);
        ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&input,-2);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable,(Node *)pAVar5);
        pVVar4 = (Variable *)operator_new(0x28);
        ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_1,(Node *)pVVar4);
        (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
      }
      else {
        if (SVar2 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_012f8200;
        pSVar3 = (StorageQualifier *)operator_new(0x28);
        ResourceDefinition::StorageQualifier::StorageQualifier
                  (pSVar3,parentStructure,STORAGE_PATCH_IN);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable,(Node *)pSVar3);
        pAVar5 = (ArrayElement *)operator_new(0x28);
        ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&input,-2);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_1,(Node *)pAVar5);
        pVVar4 = (Variable *)operator_new(0x28);
        ResourceDefinition::Variable::Variable(pVVar4,&variable_1,TYPE_FLOAT_VEC4);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_2,(Node *)pVVar4);
        (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_2);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_1);
        pVVar4 = (Variable *)operator_new(0x28);
        ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_1,(Node *)pVVar4);
        (*genCase)(context,&variable_1,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var");
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_1);
        pNVar6 = (Node *)operator_new(0x20);
        ResourceDefinition::StructMember::StructMember((StructMember *)pNVar6,&variable);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_1,pNVar6);
        pVVar4 = (Variable *)operator_new(0x28);
        ResourceDefinition::Variable::Variable(pVVar4,&variable_1,TYPE_FLOAT_VEC4);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_2,(Node *)pVVar4);
        (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_struct"
                  );
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_2);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_1);
        pAVar5 = (ArrayElement *)operator_new(0x28);
        ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&variable,-1);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_1,(Node *)pAVar5);
        pVVar4 = (Variable *)operator_new(0x28);
        ResourceDefinition::Variable::Variable(pVVar4,&variable_1,TYPE_FLOAT_VEC4);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&variable_2,(Node *)pVVar4);
        (*genCase)(context,&variable_2,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_array")
        ;
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&variable_2);
      }
      goto LAB_012f81ec;
    }
    pVVar4 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar4,&input,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar4);
    (*genCase)(context,&variable,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
LAB_012f8200:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&input);
  return;
}

Assistant:

static void generateProgramInputBlockContents (Context&										context,
											   const ResourceDefinition::Node::SharedPtr&	parentStructure,
											   tcu::TestCaseGroup*							targetGroup,
											   deUint32										presentShadersMask,
											   bool											includeEmpty,
											   void											(*genCase)(Context&										context,
																									   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																									   tcu::TestCaseGroup*							targetGroup,
																									   ProgramInterface								interface,
																									   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "empty");

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
		genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}